

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O0

Var Js::ProfilingHelpers::ProfiledLdFld<true,false,false>
              (Var instance,PropertyId propertyId,InlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,FunctionBody *functionBody,Var thisInstance)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  FldInfoFlags FVar4;
  FldInfoFlags FVar5;
  uint uVar6;
  undefined4 *puVar7;
  RecyclableObject *object_00;
  Type *type;
  _func_Var_FunctionBody_ptr_InlineCache_ptr_InlineCacheIndex_Var_PropertyId *PatchGet;
  _func_Var_FunctionBody_ptr_InlineCache_ptr_InlineCacheIndex_Var_PropertyId *PatchGetRootMethod;
  _func_Var_FunctionBody_ptr_InlineCache_ptr_InlineCacheIndex_Var_PropertyId *PatchGetMethod;
  _func_Var_FunctionBody_ptr_InlineCache_ptr_InlineCacheIndex_Var_PropertyId *PatchGetRootValue;
  _func_Var_FunctionBody_ptr_InlineCache_ptr_InlineCacheIndex_Var_PropertyId_Var *PatchGetValue;
  PropertyValueInfo propertyValueInfo;
  PropertyCacheOperationInfo operationInfo;
  RecyclableObject *thisObject;
  RecyclableObject *object;
  Var pvStack_50;
  FldInfoFlags fldInfoFlags;
  Var value;
  DynamicProfileInfo *dynamicProfileInfo;
  ScriptContext *scriptContext;
  Var thisInstance_local;
  FunctionBody *functionBody_local;
  InlineCache *pIStack_20;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  Var pvStack_10;
  PropertyId propertyId_local;
  Var instance_local;
  
  scriptContext = (ScriptContext *)thisInstance;
  thisInstance_local = functionBody;
  functionBody_local._4_4_ = inlineCacheIndex;
  pIStack_20 = inlineCache;
  inlineCache_local._4_4_ = propertyId;
  pvStack_10 = instance;
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3ae,"(instance)","instance");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3af,"(thisInstance)","thisInstance");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (inlineCache_local._4_4_ == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b0,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (pIStack_20 == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b1,"(inlineCache)","inlineCache");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (thisInstance_local == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b2,"(functionBody)","functionBody");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar2 = functionBody_local._4_4_;
  uVar6 = FunctionBody::GetInlineCacheCount((FunctionBody *)thisInstance_local);
  if (uVar6 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b3,"(inlineCacheIndex < functionBody->GetInlineCacheCount())",
                                "inlineCacheIndex < functionBody->GetInlineCacheCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar2 = functionBody_local._4_4_;
  uVar6 = FunctionBody::GetRootObjectLoadInlineCacheStart((FunctionBody *)thisInstance_local);
  if (uVar2 < uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b4,
                                "(!Root || inlineCacheIndex >= functionBody->GetRootObjectLoadInlineCacheStart())"
                                ,
                                "!Root || inlineCacheIndex >= functionBody->GetRootObjectLoadInlineCacheStart()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvStack_10);
  dynamicProfileInfo =
       (DynamicProfileInfo *)FunctionProxy::GetScriptContext((FunctionProxy *)thisInstance_local);
  value = FunctionBody::GetDynamicProfileInfo((FunctionBody *)thisInstance_local);
  object._7_1_ = FldInfo_NoInfo;
  object_00 = UnsafeVarTo<Js::RecyclableObject>(pvStack_10);
  UnsafeVarTo<Js::RecyclableObject>(scriptContext);
  PropertyCacheOperationInfo::PropertyCacheOperationInfo
            ((PropertyCacheOperationInfo *)&propertyValueInfo.allowResizingPolymorphicInlineCache);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&PatchGetValue);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)&PatchGetValue,(FunctionBody *)thisInstance_local,pIStack_20,
             functionBody_local._4_4_,true);
  bVar3 = CacheOperators::TryGetProperty<true,true,true,false,true,false,true,false,true,false>
                    (object_00,true,object_00,inlineCache_local._4_4_,&stack0xffffffffffffffb0,
                     (ScriptContext *)dynamicProfileInfo,
                     (PropertyCacheOperationInfo *)
                     &propertyValueInfo.allowResizingPolymorphicInlineCache,
                     (PropertyValueInfo *)&PatchGetValue);
  if (!bVar3) {
    pvStack_50 = Js::JavascriptOperators::PatchGetRootValueNoFastPath_Var
                           ((FunctionBody *)thisInstance_local,pIStack_20,functionBody_local._4_4_,
                            object_00,inlineCache_local._4_4_);
    type = RecyclableObject::GetType(object_00);
    CacheOperators::PretendTryGetProperty<true,false>
              (type,(PropertyCacheOperationInfo *)
                    &propertyValueInfo.allowResizingPolymorphicInlineCache,
               (PropertyValueInfo *)&PatchGetValue);
  }
  FVar5 = object._7_1_;
  FVar4 = DynamicProfileInfo::FldInfoFlagsFromCacheType
                    (propertyValueInfo.allowResizingPolymorphicInlineCache);
  FVar5 = DynamicProfileInfo::MergeFldInfoFlags(FVar5,FVar4);
  object._7_1_ = FVar5;
  FVar4 = DynamicProfileInfo::FldInfoFlagsFromSlotType(propertyValueInfo._62_1_);
  object._7_1_ = DynamicProfileInfo::MergeFldInfoFlags(FVar5,FVar4);
  UpdateFldInfoFlagsForGetSetInlineCandidate
            (object_00,(FldInfoFlags *)((long)&object + 7),
             propertyValueInfo.allowResizingPolymorphicInlineCache,pIStack_20,
             (FunctionBody *)thisInstance_local);
  DynamicProfileInfo::RecordFieldAccess
            ((DynamicProfileInfo *)value,(FunctionBody *)thisInstance_local,functionBody_local._4_4_
             ,pvStack_50,object._7_1_);
  return pvStack_50;
}

Assistant:

Var ProfilingHelpers::ProfiledLdFld(
        const Var instance,
        const PropertyId propertyId,
        InlineCache *const inlineCache,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const functionBody,
        const Var thisInstance)
    {
        Assert(instance);
        Assert(thisInstance);
        Assert(propertyId != Constants::NoProperty);
        Assert(inlineCache);
        Assert(functionBody);
        Assert(inlineCacheIndex < functionBody->GetInlineCacheCount());
        Assert(!Root || inlineCacheIndex >= functionBody->GetRootObjectLoadInlineCacheStart());

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        DynamicProfileInfo *const dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        Var value;
        FldInfoFlags fldInfoFlags = FldInfo_NoInfo;
        if (Root || (VarIs<RecyclableObject>(instance) && VarIs<RecyclableObject>(thisInstance)))
        {
            RecyclableObject *const object = UnsafeVarTo<RecyclableObject>(instance);
            RecyclableObject *const thisObject = UnsafeVarTo<RecyclableObject>(thisInstance);

            if (!Root && Method && (propertyId == PropertyIds::apply || propertyId == PropertyIds::call) && VarIs<ScriptFunction>(object))
            {
                // If the property being loaded is "apply"/"call", make an optimistic assumption that apply/call is not overridden and
                // undefer the function right here if it was defer parsed before. This is required so that the load of "apply"/"call"
                // happens from the same "type". Otherwise, we will have a polymorphic cache for load of "apply"/"call".
                ScriptFunction *fn = UnsafeVarTo<ScriptFunction>(object);
                if (fn->GetType()->GetEntryPoint() == JavascriptFunction::DeferredParsingThunk)
                {
                    JavascriptFunction::DeferredParse(&fn);
                }
            }

            PropertyCacheOperationInfo operationInfo;
            PropertyValueInfo propertyValueInfo;
            PropertyValueInfo::SetCacheInfo(&propertyValueInfo, functionBody, inlineCache, inlineCacheIndex, true);
            if (!CacheOperators::TryGetProperty<true, true, true, !Root && !Method, true, !Root, true, false, true, false>(
                    object,
                    Root,
                    object,
                    propertyId,
                    &value,
                    scriptContext,
                    &operationInfo,
                    &propertyValueInfo))
            {
                const auto PatchGetValue = &JavascriptOperators::PatchGetValueWithThisPtrNoFastPath;
                const auto PatchGetRootValue = &JavascriptOperators::PatchGetRootValueNoFastPath_Var;
                const auto PatchGetMethod = &JavascriptOperators::PatchGetMethodNoFastPath;
                const auto PatchGetRootMethod = &JavascriptOperators::PatchGetRootMethodNoFastPath_Var;
                const auto PatchGet =
                    Root
                        ? Method ? PatchGetRootMethod : PatchGetRootValue
                        : PatchGetMethod ;
                value = (!Root && !Method) ? PatchGetValue(functionBody, inlineCache, inlineCacheIndex, object, propertyId, thisObject) :
                    PatchGet(functionBody, inlineCache, inlineCacheIndex, object, propertyId);
                CacheOperators::PretendTryGetProperty<true, false>(object->GetType(), &operationInfo, &propertyValueInfo);
            }
            else if (!Root && !Method)
            {
                // Inline cache hit. oldflags must match the new ones. If not there is mark it as polymorphic as there is likely
                // a bailout to interpreter and change in the inline cache type.
                const FldInfoFlags oldflags = dynamicProfileInfo->GetFldInfo(functionBody, inlineCacheIndex)->flags;
                if ((oldflags != FldInfo_NoInfo) &&
                    !(oldflags & DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType)))
                {
                    fldInfoFlags = DynamicProfileInfo::MergeFldInfoFlags(fldInfoFlags, FldInfo_Polymorphic);
                }
            }

            if (!Root && operationInfo.isPolymorphic)
            {
                fldInfoFlags = DynamicProfileInfo::MergeFldInfoFlags(fldInfoFlags, FldInfo_Polymorphic);
            }
            fldInfoFlags =
                DynamicProfileInfo::MergeFldInfoFlags(
                    fldInfoFlags,
                    DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType));
            fldInfoFlags =
                DynamicProfileInfo::MergeFldInfoFlags(
                    fldInfoFlags,
                    DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));

            if (!Method)
            {
                UpdateFldInfoFlagsForGetSetInlineCandidate(
                    object,
                    fldInfoFlags,
                    operationInfo.cacheType,
                    inlineCache,
                    functionBody);
                if (!Root && CallApplyTarget)
                {
                    UpdateFldInfoFlagsForCallApplyInlineCandidate(
                        object,
                        fldInfoFlags,
                        operationInfo.cacheType,
                        inlineCache,
                        functionBody);
                }
            }
        }
        else
        {
            Assert(!Root);
            const auto PatchGetValue = &JavascriptOperators::PatchGetValue<false, InlineCache>;
            const auto PatchGetMethod = &JavascriptOperators::PatchGetMethod<false, InlineCache>;
            const auto PatchGet = Method ? PatchGetMethod : PatchGetValue;
            value = PatchGet(functionBody, inlineCache, inlineCacheIndex, instance, propertyId);
        }

        dynamicProfileInfo->RecordFieldAccess(functionBody, inlineCacheIndex, value, fldInfoFlags);
        return value;
    }